

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::TargetTask::inputsAvailable(TargetTask *this,TaskInterface ti)

{
  SmallPtrSet<llbuild::buildsystem::Node_*,_1U> *this_00;
  StringRef Str;
  TaskInterface ti_00;
  StringRef filename;
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  raw_ostream *prVar4;
  BuildSystemImpl *this_01;
  void *pvVar5;
  Child CVar6;
  void *pvVar7;
  SmallPtrSet<llbuild::buildsystem::Node_*,_1U> *__range3;
  SmallPtrSetIteratorImpl SVar8;
  iterator iVar9;
  string inputs;
  iterator __begin3;
  raw_string_ostream inputsStream;
  Twine local_178;
  string local_160;
  Child local_140 [3];
  StringRef local_128;
  BuildValue local_118;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  pvVar5 = ti.ctx;
  pvVar7 = ti.impl;
  bVar1 = llbuild::core::TaskInterface::isCancelled((TaskInterface *)&stack0xfffffffffffffe68);
  if (bVar1) {
    local_118.kind = SkippedCommand;
  }
  else {
    if ((this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
        super_SmallPtrSetImplBase.NumNonEmpty !=
        (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
        super_SmallPtrSetImplBase.NumTombstones) {
      this_00 = &this->missingInputNodes;
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_local_buf[0] = '\0';
      local_118.valueData.asOutputInfo.mode._0_4_ = 1;
      local_118.signature.value._0_4_ = 0;
      local_118.signature.value._4_4_ = 0;
      local_118.valueData.asOutputInfo.device._0_4_ = 0;
      local_118.valueData.asOutputInfo.device._4_4_ = 0;
      local_118.valueData.asOutputInfo.inode._0_4_ = 0;
      local_118.valueData.asOutputInfo.inode._4_4_ = 0;
      local_118.kind = 0x204248;
      local_118.numOutputInfos = 0;
      local_118.valueData.asOutputInfo.size = (uint64_t)&local_160;
      SVar8 = (SmallPtrSetIteratorImpl)
              llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::begin
                        (&this_00->super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>);
      local_140._0_16_ = (undefined1  [16])SVar8;
      iVar9 = llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::end
                        (&this_00->super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>);
      CVar6 = (Child)SVar8.Bucket;
      while (CVar6.twine != (Twine *)iVar9.super_SmallPtrSetIteratorImpl.Bucket) {
        pNVar2 = llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator*
                           ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)local_140);
        local_178._0_16_ =
             llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::begin
                       (&this_00->super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>);
        pNVar3 = llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator*
                           ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)&local_178);
        if (pNVar2 != pNVar3) {
          llvm::raw_ostream::operator<<((raw_ostream *)&local_118,", ");
        }
        prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&local_118,"\'");
        Str.Data = (pNVar2->name)._M_dataplus._M_p;
        Str.Length = (pNVar2->name)._M_string_length;
        prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
        llvm::raw_ostream::operator<<(prVar4,"\'");
        llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>::operator++
                  ((SmallPtrSetIterator<llbuild::buildsystem::Node_*> *)local_140);
        CVar6 = local_140[0];
      }
      llvm::raw_ostream::flush((raw_ostream *)&local_118);
      ti_00.ctx = pvVar5;
      ti_00.impl = pvVar7;
      this_01 = getBuildSystem(ti_00);
      filename.Data = (this_01->mainFilename)._M_dataplus._M_p;
      filename.Length = (this_01->mainFilename)._M_string_length;
      llvm::Twine::Twine(&local_60,"cannot build target \'");
      local_128.Data = (this->target->name)._M_dataplus._M_p;
      local_128.Length = (this->target->name)._M_string_length;
      llvm::Twine::Twine(&local_78,&local_128);
      llvm::Twine::concat(&local_48,&local_60,&local_78);
      llvm::Twine::Twine(&local_90,"\' due to missing inputs: ");
      llvm::Twine::concat(&local_178,&local_48,&local_90);
      llvm::Twine::Twine(&local_a8,&local_160);
      llvm::Twine::concat((Twine *)local_140,&local_178,&local_a8);
      BuildSystemImpl::error(this_01,filename,(Twine *)local_140);
      (*this_01->delegate->_vptr_BuildSystemDelegate[6])();
      llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&local_118);
      std::__cxx11::string::_M_dispose();
    }
    local_118.kind = Target;
  }
  local_118.numOutputInfos = 0;
  local_118.signature.value._0_4_ = 0;
  local_118.signature.value._4_4_ = 0;
  local_118.valueData.asOutputInfo.device._0_4_ = 0;
  local_118.valueData.asOutputInfo.device._4_4_ = 0;
  local_118.valueData.asOutputInfo.inode._0_4_ = 0;
  local_118.valueData.asOutputInfo.inode._4_4_ = 0;
  local_118.valueData.asOutputInfo.mode._0_4_ = 0;
  local_118.valueData.asOutputInfo.mode._4_4_ = 0;
  local_118.valueData.asOutputInfo.size._0_4_ = 0;
  local_118.valueData.asOutputInfo.size._4_4_ = 0;
  local_118.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
  local_118.valueData._36_8_ = 0;
  local_118.valueData._44_8_ = 0;
  local_118.valueData._52_8_ = 0;
  local_118.valueData._60_8_ = 0;
  local_118.valueData._68_8_ = 0;
  local_118.valueData._76_4_ = 0;
  local_118.stringValues.contents._0_4_ = 0;
  local_118.stringValues.contents._4_4_ = 0;
  local_118.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_160,&local_118);
  llbuild::core::TaskInterface::complete
            ((TaskInterface *)&stack0xfffffffffffffe68,(ValueType *)&local_160,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_118);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // If the build should cancel, do nothing.
    if (ti.isCancelled()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    if (!missingInputNodes.empty()) {
      std::string inputs;
      raw_string_ostream inputsStream(inputs);
      for (Node* missingInputNode : missingInputNodes) {
        if (missingInputNode != *missingInputNodes.begin()) {
          inputsStream << ", ";
        }
        inputsStream << "'" << missingInputNode->getName() << "'";
      }
      inputsStream.flush();

      // FIXME: Design the logging and status output APIs.
      auto& system = getBuildSystem(ti);
      system.error(system.getMainFilename(),
                   (Twine("cannot build target '") + target.getName() +
                    "' due to missing inputs: " + inputs));
      
      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }
    
    // Complete the task immediately.
    ti.complete(BuildValue::makeTarget().toData());
  }